

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O0

void __thiscall Assimp::Collada::Mesh::~Mesh(Mesh *this)

{
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *local_38;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *local_18;
  Mesh *this_local;
  
  std::vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>::~vector
            (&this->mSubMeshes);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->mFacePosIndices);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->mFaceSize);
  local_18 = (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)this->mNumUVComponents;
  do {
    local_18 = local_18 + -1;
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector(local_18);
  } while (local_18 != this->mColors);
  local_38 = this->mColors;
  do {
    local_38 = local_38 + -1;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_38);
  } while (local_38 !=
           (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)this->mTexCoords);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->mBitangents);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->mTangents);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->mNormals);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->mPositions);
  std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
  ~vector(&this->mPerVertexData);
  std::__cxx11::string::~string((string *)&this->mVertexID);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Mesh()
    {
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)
            mNumUVComponents[i] = 2;
    }